

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O0

uint32_t __thiscall kaitai::kstream::read_u4le(kstream *this)

{
  uint32_t local_14;
  kstream *pkStack_10;
  uint32_t t;
  kstream *this_local;
  
  pkStack_10 = this;
  std::istream::read((char *)this->m_io,(long)&local_14);
  return local_14;
}

Assistant:

uint32_t kaitai::kstream::read_u4le() {
    uint32_t t;
    m_io->read(reinterpret_cast<char *>(&t), 4);
#if __BYTE_ORDER == __BIG_ENDIAN
    t = bswap_32(t);
#endif
    return t;
}